

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_encryption.cc
# Opt level: O0

bool __thiscall QPDF::allowModifyAll(QPDF *this)

{
  bool bVar1;
  bool local_1c;
  bool local_1b;
  bool local_1a;
  bool local_19;
  int local_18;
  int iStack_14;
  bool status;
  int P;
  int R;
  QPDF *this_local;
  
  iStack_14 = 0;
  local_18 = 0;
  local_19 = true;
  _P = this;
  bVar1 = isEncrypted(this,&stack0xffffffffffffffec,&local_18);
  if (bVar1) {
    bVar1 = is_bit_set(local_18,4);
    local_1a = false;
    if (bVar1) {
      local_1a = is_bit_set(local_18,6);
    }
    local_19 = local_1a;
    if (2 < iStack_14) {
      local_1b = false;
      if (local_1a != false) {
        bVar1 = is_bit_set(local_18,9);
        local_1c = false;
        if (bVar1) {
          local_1c = is_bit_set(local_18,0xb);
        }
        local_1b = local_1c;
      }
      local_19 = local_1b;
    }
  }
  return local_19;
}

Assistant:

bool
QPDF::allowModifyAll()
{
    int R = 0;
    int P = 0;
    bool status = true;
    if (isEncrypted(R, P)) {
        status = (is_bit_set(P, 4) && is_bit_set(P, 6));
        if (R >= 3) {
            status = status && (is_bit_set(P, 9) && is_bit_set(P, 11));
        }
    }
    return status;
}